

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,char *string)

{
  QTextStreamPrivate *this_00;
  long in_FS_OFFSET;
  QUtf8StringView local_58;
  QMessageLogger local_48;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  local_28 = string;
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QTextStream: No device");
  }
  else {
    QBasicUtf8StringView<false>::QBasicUtf8StringView<const_char_*,_true>(&local_58,&local_28);
    QTextStreamPrivate::putString(this_00,local_58,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(const char *string)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putString(QUtf8StringView(string));
    return *this;
}